

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

qsizetype __thiscall QBitArray::count(QBitArray *this,bool on)

{
  ushort uVar1;
  char *pcVar2;
  long lVar3;
  qsizetype qVar4;
  char *pcVar5;
  ushort *puVar6;
  ushort *puVar7;
  ushort *puVar8;
  uint uVar9;
  ulong uVar10;
  
  pcVar2 = (this->d).d.ptr;
  lVar3 = (this->d).d.size;
  pcVar5 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = &QByteArray::_empty;
  }
  puVar8 = (ushort *)(pcVar2 + lVar3);
  qVar4 = 0;
  for (puVar6 = (ushort *)(pcVar5 + 4); puVar6 + 2 <= puVar8; puVar6 = puVar6 + 4) {
    uVar10 = *(ulong *)((long)puVar6 + -3) -
             (*(ulong *)((long)puVar6 + -3) >> 1 & 0x5555555555555555);
    uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
    qVar4 = qVar4 + (((uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  }
  if (puVar8 < puVar6) {
    puVar7 = (ushort *)((long)puVar6 + -3);
  }
  else {
    puVar7 = (ushort *)((long)puVar6 + 1);
    uVar9 = *(uint *)((long)puVar6 + -3) - (*(uint *)((long)puVar6 + -3) >> 1 & 0x55555555);
    uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333);
    qVar4 = qVar4 + (ulong)(((uVar9 >> 4) + uVar9 & 0xf0f0f0f) * 0x1010101 >> 0x18);
  }
  if ((ushort *)((long)puVar7 + 1U) < puVar8) {
    uVar1 = *puVar7;
    puVar7 = puVar7 + 1;
    uVar9 = (uint)uVar1 - (uVar1 >> 1 & 0x5555);
    uVar9 = (uVar9 >> 2 & 0x3333) + (uVar9 & 0x3333);
    uVar9 = (uVar9 >> 4) + uVar9 & 0xf0f;
    qVar4 = qVar4 + (ulong)((uVar9 >> 8) + uVar9 & 0xff);
  }
  if (puVar7 < puVar8) {
    qVar4 = qVar4 + (ulong)(((uint)(byte)*puVar7 * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c
                           );
  }
  if (!on) {
    qVar4 = lVar3 * 8 - (qVar4 + *pcVar5);
  }
  return qVar4;
}

Assistant:

const T *data() const noexcept { return ptr; }